

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QWidget *parent)

{
  DateTimePickerPrivate *this_00;
  QSizePolicy type;
  undefined1 local_30 [16];
  Connection local_20 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a7508;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001a76b8;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDateTime);
  (this->d).d = this_00;
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_20,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection(local_20);
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)(local_30 + 8),(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)(local_30 + 8));
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_30,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}